

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.h
# Opt level: O0

void __thiscall
ktx::Reporter::
fatal<char_const*const&,std::__cxx11::string,unsigned_int,unsigned_int,unsigned_int_const&,unsigned_int_const&,unsigned_int&>
          (Reporter *this,ReturnCode return_code,char **args,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,uint *args_2,
          uint *args_3,uint *args_4,uint *args_5,uint *args_6)

{
  format_string<std::__cxx11::basic_string<char>_&> fmt;
  format_string<> fmt_00;
  format_string<std::__cxx11::basic_string<char>,_unsigned_int,_unsigned_int,_const_unsigned_int_&,_const_unsigned_int_&,_unsigned_int_&>
  fmt_01;
  undefined8 uVar1;
  uint *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  undefined4 in_ESI;
  char *in_RDI;
  uint *in_R8;
  undefined8 in_stack_00000008;
  FatalError *in_stack_00000010;
  ostream *in_stack_ffffffffffffff00;
  ostream *os;
  char *in_stack_ffffffffffffff08;
  size_t in_stack_ffffffffffffff10;
  char *local_e0 [2];
  uint *local_d0;
  size_t local_c8;
  char *local_c0;
  size_t local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_00;
  undefined4 in_stack_ffffffffffffff70;
  char *pcVar2;
  uint *args_3_00;
  uint **args_4_00;
  
  pcVar2 = "{} fatal: ";
  local_c0 = "{} fatal: ";
  local_b8 = std::char_traits<char>::length((char_type *)0x23972d);
  fmt.str_.size_ = in_stack_ffffffffffffff10;
  fmt.str_.data_ = in_stack_ffffffffffffff08;
  ::fmt::v10::print<std::__cxx11::string&>
            (in_stack_ffffffffffffff00,fmt,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&std::cerr);
  args_4_00 = &local_d0;
  args_3_00 = *(uint **)in_RDX;
  args_00 = in_RDX;
  local_d0 = args_3_00;
  local_c8 = std::char_traits<char>::length((char_type *)0x2397d1);
  fmt_01.str_.size_ = (size_t)pcVar2;
  fmt_01.str_.data_ = in_RDI;
  ::fmt::v10::
  print<std::__cxx11::string,unsigned_int,unsigned_int,unsigned_int_const&,unsigned_int_const&,unsigned_int&>
            ((ostream *)CONCAT44(in_ESI,in_stack_ffffffffffffff70),fmt_01,args_00,in_RCX,in_R8,
             args_3_00,(uint *)args_4_00,(uint *)in_RDX);
  os = (ostream *)local_e0;
  local_e0[0] = "\n";
  pcVar2 = (char *)std::char_traits<char>::length((char_type *)0x2398a0);
  *(char **)(os + 8) = pcVar2;
  fmt_00.str_.size_ = in_stack_ffffffffffffff10;
  fmt_00.str_.data_ = in_stack_ffffffffffffff08;
  ::fmt::v10::print<>(os,fmt_00);
  uVar1 = __cxa_allocate_exception(0x10);
  FatalError::FatalError(in_stack_00000010,in_stack_00000008._4_4_);
  __cxa_throw(uVar1,&FatalError::typeinfo,FatalError::~FatalError);
}

Assistant:

void fatal(ReturnCode return_code, Args&&... args) {
        fmt::print(std::cerr, "{} fatal: ", commandName);
        fmt::print(std::cerr, std::forward<Args>(args)...);
        fmt::print(std::cerr, "\n");
        throw FatalError(return_code);
    }